

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O3

void __thiscall StringType::Prepare(StringType *this,Env *env,int flags)

{
  ID *pIVar1;
  int iVar2;
  ID *this_00;
  Field *this_01;
  Type *type;
  char *pcVar3;
  string local_48;
  
  if ((flags & 1U) != 0) {
    iVar2 = (*(this->super_Type).super_DataDepElement._vptr_DataDepElement[0x13])(this,env);
    if (iVar2 < 0) {
      this_00 = (ID *)operator_new(0x78);
      pIVar1 = (this->super_Type).value_var_;
      if (pIVar1 == (ID *)0x0) {
        pcVar3 = "val";
      }
      else {
        pcVar3 = (pIVar1->name)._M_dataplus._M_p;
      }
      strfmt_abi_cxx11_(&local_48,"%s_string_length",pcVar3);
      ID::ID(this_00,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      this_01 = (Field *)operator_new(0xa0);
      type = Type::Clone(&extern_type_int->super_Type);
      Field::Field(this_01,TEMP_VAR_FIELD,0,this_00,type);
      (this_01->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Field_00144208;
      this->string_length_var_field_ = this_01;
      Field::Prepare(this_01,env);
    }
  }
  Type::Prepare(&this->super_Type,env,flags);
  return;
}

Assistant:

void StringType::Prepare(Env* env, int flags)
	{
	if ( (flags & TO_BE_PARSED) && StaticSize(env) < 0 )
		{
		ID* string_length_var = new ID(
			strfmt("%s_string_length", value_var() ? value_var()->Name() : "val"));
		string_length_var_field_ = new TempVarField(string_length_var, extern_type_int->Clone());
		string_length_var_field_->Prepare(env);
		}
	Type::Prepare(env, flags);
	}